

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joysticks.c
# Opt level: O0

void draw_joystick(Joystick *j,int x,int y,int width,int height)

{
  int iVar1;
  int iVar2;
  float fVar3;
  int button_width;
  float value;
  int axis_width;
  int button_height;
  int axis_height;
  int i;
  int height_local;
  int width_local;
  int y_local;
  int x_local;
  Joystick *j_local;
  
  iVar1 = (height * 3) / 4;
  if (j->axis_count != 0) {
    iVar2 = width / j->axis_count;
    for (button_height = 0; button_height < j->axis_count; button_height = button_height + 1) {
      fVar3 = j->axes[button_height] / 2.0 + 0.5;
      glColor3f(0x3e99999a,0x3e99999a);
      glRecti(x + button_height * iVar2,y,x + (button_height + 1) * iVar2,y + iVar1);
      glColor3f(0x3f800000,0x3f800000);
      glRecti(x + button_height * iVar2,y + (int)(fVar3 * (float)(iVar1 + -5)),
              x + (button_height + 1) * iVar2,y + 5 + (int)(fVar3 * (float)(iVar1 + -5)));
    }
  }
  if (j->button_count != 0) {
    iVar2 = width / j->button_count;
    for (button_height = 0; button_height < j->button_count; button_height = button_height + 1) {
      if (j->buttons[button_height] == '\0') {
        glColor3f(0x3e99999a,0x3e99999a);
      }
      else {
        glColor3f(0x3f800000,0x3f800000);
      }
      glRecti(x + button_height * iVar2,y + iVar1,x + (button_height + 1) * iVar2,
              y + iVar1 + height / 4);
    }
  }
  return;
}

Assistant:

static void draw_joystick(Joystick* j, int x, int y, int width, int height)
{
    int i;
    const int axis_height = 3 * height / 4;
    const int button_height = height / 4;

    if (j->axis_count)
    {
        const int axis_width = width / j->axis_count;

        for (i = 0;  i < j->axis_count;  i++)
        {
            float value = j->axes[i] / 2.f + 0.5f;

            glColor3f(0.3f, 0.3f, 0.3f);
            glRecti(x + i * axis_width,
                    y,
                    x + (i + 1) * axis_width,
                    y + axis_height);

            glColor3f(1.f, 1.f, 1.f);
            glRecti(x + i * axis_width,
                    y + (int) (value * (axis_height - 5)),
                    x + (i + 1) * axis_width,
                    y + 5 + (int) (value * (axis_height - 5)));
        }
    }

    if (j->button_count)
    {
        const int button_width = width / j->button_count;

        for (i = 0;  i < j->button_count;  i++)
        {
            if (j->buttons[i])
                glColor3f(1.f, 1.f, 1.f);
            else
                glColor3f(0.3f, 0.3f, 0.3f);

            glRecti(x + i * button_width,
                    y + axis_height,
                    x + (i + 1) * button_width,
                    y + axis_height + button_height);
        }
    }
}